

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::taylor_inplace_multiplier<double,_4,_5,_5,_5>::mul(double *p1,double *p2)

{
  int iVar1;
  int local_1c;
  int i;
  double *p2_local;
  double *p1_local;
  
  local_1c = binomial(8,4);
  while( true ) {
    iVar1 = binomial(9,5);
    if (iVar1 <= local_1c) break;
    p1[local_1c] = p2[local_1c] * *p1 + p1[local_1c];
    local_1c = local_1c + 1;
  }
  taylor_inplace_multiplier<double,_4,_4,_5,_0>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    if (Ndeg <= Ndeg2) {
      for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
           i < binomial(Nvar + Ndeg, Ndeg);
           i++)
        p1[i] += p2[i] * p1[0];
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg - 1, Ndeg2, 0>::mul(
        p1, p2); // Do lower degree terms, or go to (4)
  }